

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

bool __thiscall Parser::checkEquLabel(Parser *this)

{
  pointer pCVar1;
  bool bVar2;
  Token *startToken;
  Token *pTVar3;
  Identifier *symbol;
  string *value;
  char *text;
  uint uVar4;
  
  updateFileInfo(this);
  startToken = peekToken(this,0);
  if (startToken->type != Identifier) {
    return false;
  }
  pTVar3 = peekToken(this,1);
  uVar4 = (uint)(pTVar3->type == Colon);
  pTVar3 = peekToken(this,uVar4 + 1);
  if (pTVar3->type == Equ) {
    pTVar3 = peekToken(this,uVar4 + 2);
    if (pTVar3->type == EquValue) {
      pTVar3 = peekToken(this,0);
      symbol = Token::identifierValue(pTVar3);
      pTVar3 = peekToken(this,uVar4 + 2);
      value = &Token::stringValue(pTVar3)->_value;
      eatTokens(this,uVar4 + 3);
      pCVar1 = (this->conditionStack).
               super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pCVar1[-1].inTrueBlock != true) {
        return true;
      }
      if (pCVar1[-1].inUnknownBlock == true) {
        printError<>(this,startToken,"equ not allowed inside of block with non-trivial condition");
        return true;
      }
      if (this->initializingMacro == true) {
        std::
        _Rb_tree<Identifier,Identifier,std::_Identity<Identifier>,std::less<Identifier>,std::allocator<Identifier>>
        ::_M_insert_unique<Identifier_const&>
                  ((_Rb_tree<Identifier,Identifier,std::_Identity<Identifier>,std::less<Identifier>,std::allocator<Identifier>>
                    *)&this->macroLabels,symbol);
        return true;
      }
      bVar2 = SymbolTable::isValidSymbolName(symbol);
      if (bVar2) {
        bVar2 = SymbolTable::symbolExists
                          (&Global.symbolTable,symbol,Global.FileInfo.FileNum,Global.Section);
        if (!bVar2) {
          addEquation(this,startToken,symbol,value);
          return true;
        }
        text = "Equation name \"%s\" already defined";
      }
      else {
        text = "Invalid equation name \"%s\"";
      }
      printError<Identifier>(this,startToken,text,symbol);
      return true;
    }
  }
  return false;
}

Assistant:

bool Parser::checkEquLabel()
{
	updateFileInfo();

	const Token& start = peekToken();
	if (start.type == TokenType::Identifier)
	{
		int pos = 1;
		if (peekToken(pos).type == TokenType::Colon)
			pos++;

		if (peekToken(pos).type == TokenType::Equ &&
			peekToken(pos+1).type == TokenType::EquValue)
		{
			const Identifier &name = peekToken(0).identifierValue();
			const StringLiteral &value = peekToken(pos+1).stringValue();
			eatTokens(pos+2);

			// skip the equ if it's inside a false conditional block
			if (!isInsideTrueBlock())
				return true;

			// equs can't be inside blocks whose condition can only be
			// evaluated during validation
			if (isInsideUnknownBlock())
			{
				printError(start, "equ not allowed inside of block with non-trivial condition");
				return true;
			}

			// when parsing a macro, just remember the equ name
			if (initializingMacro)
			{
				macroLabels.insert(name);
				return true;
			}

			if (!Global.symbolTable.isValidSymbolName(name))
			{
				printError(start, "Invalid equation name \"%s\"",name);
				return true;
			}

			if (Global.symbolTable.symbolExists(name,Global.FileInfo.FileNum,Global.Section))
			{
				printError(start, "Equation name \"%s\" already defined",name);
				return true;
			}

			addEquation(start,name,value.string());
			return true;
		}
	}

	return false;
}